

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  __m128 _outp_2;
  __m128 _p_2;
  __m128 _b;
  __m256 _outp_1;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _outp;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  int size;
  binary_op_mul op;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  int local_374;
  undefined8 *local_360;
  undefined1 (*local_350) [64];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined4 uStack_84;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  
  iVar4 = in_ECX * in_R8D;
  local_374 = 0;
  auVar5 = vbroadcastss_avx512f(ZEXT416((uint)*in_RSI));
  local_360 = in_RDX;
  local_350 = in_RDI;
  for (; local_374 + 0xf < iVar4; local_374 = local_374 + 0x10) {
    auVar6 = vmulps_avx512f(*local_350,auVar5);
    local_440 = auVar6._0_8_;
    uStack_438 = auVar6._8_8_;
    uStack_430 = auVar6._16_8_;
    uStack_428 = auVar6._24_8_;
    uStack_420 = auVar6._32_8_;
    uStack_418 = auVar6._40_8_;
    uStack_410 = auVar6._48_8_;
    uStack_408 = auVar6._56_8_;
    *local_360 = local_440;
    local_360[1] = uStack_438;
    local_360[2] = uStack_430;
    local_360[3] = uStack_428;
    local_360[4] = uStack_420;
    local_360[5] = uStack_418;
    local_360[6] = uStack_410;
    local_360[7] = uStack_408;
    local_350 = local_350 + 1;
    local_360 = local_360 + 8;
  }
  fVar1 = *in_RSI;
  auVar2 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x30);
  auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
  for (; local_374 + 7 < iVar4; local_374 = local_374 + 8) {
    local_a0 = (float)*(undefined8 *)*local_350;
    fStack_9c = (float)((ulong)*(undefined8 *)*local_350 >> 0x20);
    fStack_98 = (float)*(undefined8 *)(*local_350 + 8);
    fStack_94 = (float)((ulong)*(undefined8 *)(*local_350 + 8) >> 0x20);
    fStack_90 = (float)*(undefined8 *)(*local_350 + 0x10);
    fStack_8c = (float)((ulong)*(undefined8 *)(*local_350 + 0x10) >> 0x20);
    fStack_88 = (float)*(undefined8 *)(*local_350 + 0x18);
    uStack_84 = (undefined4)((ulong)*(undefined8 *)(*local_350 + 0x18) >> 0x20);
    local_c0 = auVar3._0_4_;
    fStack_bc = auVar3._4_4_;
    fStack_b8 = auVar3._8_4_;
    fStack_b4 = auVar3._12_4_;
    fStack_b0 = auVar2._0_4_;
    fStack_ac = auVar2._4_4_;
    fStack_a8 = auVar2._8_4_;
    *local_360 = CONCAT44(fStack_9c * fStack_bc,local_a0 * local_c0);
    local_360[1] = CONCAT44(fStack_94 * fStack_b4,fStack_98 * fStack_b8);
    local_360[2] = CONCAT44(fStack_8c * fStack_ac,fStack_90 * fStack_b0);
    local_360[3] = CONCAT44(uStack_84,fStack_88 * fStack_a8);
    local_350 = (undefined1 (*) [64])(*local_350 + 0x20);
    local_360 = local_360 + 4;
  }
  fVar1 = *in_RSI;
  for (; local_374 + 3 < iVar4; local_374 = local_374 + 4) {
    local_60 = (float)*(undefined8 *)*local_350;
    fStack_5c = (float)((ulong)*(undefined8 *)*local_350 >> 0x20);
    fStack_58 = (float)*(undefined8 *)(*local_350 + 8);
    fStack_54 = (float)((ulong)*(undefined8 *)(*local_350 + 8) >> 0x20);
    *local_360 = CONCAT44(fStack_5c * fVar1,local_60 * fVar1);
    local_360[1] = CONCAT44(fStack_54 * fVar1,fStack_58 * fVar1);
    local_350 = (undefined1 (*) [64])(*local_350 + 0x10);
    local_360 = local_360 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}